

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::getSymbolId
          (TGlslangToSpvTraverser *this,TIntermSymbol *symbol)

{
  Id IVar1;
  TIntermediate *this_00;
  uint uVar2;
  bool bVar3;
  int iVar4;
  Decoration DVar5;
  StorageClass SVar6;
  undefined4 extraout_var;
  pointer ppVar7;
  long lVar8;
  TType *pTVar9;
  pointer ppVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  long *plVar13;
  TQualifier *pTVar14;
  SpvVersion *pSVar15;
  ulong uVar16;
  size_type sVar17;
  reference pvVar18;
  undefined8 *puVar19;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_bool>
  pVar20;
  bool local_d9;
  optional<int> local_c8;
  Decoration local_c0;
  uint local_bc;
  Decoration decoration;
  uint i;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> memory;
  key_type kStack_98;
  uint stride;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_90;
  undefined1 local_88;
  uint local_7c;
  pair<const_unsigned_int,_unsigned_int> local_78;
  key_type local_70;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_68;
  uint local_5c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_58;
  iterator iter_1;
  uint uStack_48;
  bool mayNeedToReuseBuiltIn;
  pair<unsigned_int,_unsigned_int> forcedType;
  BuiltIn builtIn;
  Id local_34;
  key_type kStack_30;
  Id id;
  _Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false> local_28;
  iterator iter;
  TIntermSymbol *symbol_local;
  TGlslangToSpvTraverser *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>)
       (_Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>)symbol;
  iVar4 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
  kStack_30 = CONCAT44(extraout_var,iVar4);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<long_long,_unsigned_int,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>_>
       ::find(&this->symbolValues,&stack0xffffffffffffffd0);
  register0x00000000 =
       (__node_type *)
       std::
       unordered_map<long_long,_unsigned_int,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>_>
       ::end(&this->symbolValues);
  bVar3 = std::__detail::operator!=
                    ((_Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false> *)
                     &forcedType.second,&local_28);
  if (bVar3) {
    ppVar7 = std::__detail::_Node_iterator<std::pair<const_long_long,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_long_long,_unsigned_int>,_false,_false> *)
                        &local_28);
    return ppVar7->second;
  }
  lVar8 = (**(code **)(*(long *)iter.
                                super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                ._M_cur + 0x110))();
  forcedType.first =
       TranslateBuiltInDecoration(this,(TBuiltInVariable)(*(ulong *)(lVar8 + 8) >> 7) & 0x1ff,false)
  ;
  lVar8 = (**(code **)(*(long *)iter.
                                super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                ._M_cur + 0x110))();
  uVar16 = *(ulong *)(lVar8 + 8);
  pTVar9 = (TType *)(**(code **)(*(long *)iter.
                                          super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                          ._M_cur + 0xf0))();
  register0x00000000 = getForcedType(this,(TBuiltInVariable)(uVar16 >> 7) & 0x1ff,pTVar9);
  local_d9 = forcedType.first == 0x14d2 || forcedType.first == 0x14d3;
  iter_1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._3_1_
       = local_d9;
  if (forcedType.first == 0x14d2 || forcedType.first == 0x14d3) {
    local_5c = forcedType.first;
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->builtInVariableIds,&local_5c);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->builtInVariableIds);
    bVar3 = std::__detail::operator!=(&local_68,&local_58);
    if (bVar3) {
      ppVar10 = std::__detail::
                _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                            *)&local_58);
      IVar1 = ppVar10->second;
      local_34 = IVar1;
      local_70 = (**(code **)(*(long *)iter.
                                       super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                       ._M_cur + 0x180))();
      pmVar11 = std::
                unordered_map<long_long,_unsigned_int,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>_>
                ::operator[](&this->symbolValues,&local_70);
      *pmVar11 = IVar1;
      uVar2 = uStack_48;
      if (uStack_48 != 0) {
        pmVar12 = std::
                  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[](&this->forceType,&local_34);
        *pmVar12 = uVar2;
      }
      return local_34;
    }
  }
  iVar4 = (**(code **)(*(long *)iter.
                                super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                ._M_cur + 0x100))();
  if (iVar4 == 0x16) {
    return 0;
  }
  local_34 = createSpvVariable(this,(TIntermSymbol *)
                                    iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur,
                               iter_1.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur._4_4_);
  if ((iter_1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
       _3_1_ & 1) != 0) {
    local_7c = forcedType.first;
    std::pair<const_unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int_&,_true>
              (&local_78,&local_7c,&local_34);
    pVar20 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::insert(&this->builtInVariableIds,&local_78);
    local_90._M_cur =
         (__node_type *)
         pVar20.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
         _M_cur;
    local_88 = pVar20.second;
  }
  IVar1 = local_34;
  kStack_98 = (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x180))();
  pmVar11 = std::
            unordered_map<long_long,_unsigned_int,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>_>
            ::operator[](&this->symbolValues,&stack0xffffffffffffff68);
  *pmVar11 = IVar1;
  uVar2 = uStack_48;
  if (uStack_48 != 0) {
    pmVar12 = std::
              unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::operator[](&this->forceType,&local_34);
    *pmVar12 = uVar2;
  }
  iVar4 = (**(code **)(*(long *)iter.
                                super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                ._M_cur + 0x100))();
  IVar1 = local_34;
  if (iVar4 != 0x10) {
    pTVar9 = (TType *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    DVar5 = TranslatePrecisionDecoration(pTVar9);
    spv::Builder::addDecoration(&this->builder,IVar1,DVar5,-1);
    IVar1 = local_34;
    plVar13 = (long *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    pTVar14 = (TQualifier *)(**(code **)(*plVar13 + 0x58))();
    DVar5 = TranslateInterpolationDecoration(this,pTVar14);
    spv::Builder::addDecoration(&this->builder,IVar1,DVar5,-1);
    IVar1 = local_34;
    plVar13 = (long *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    pTVar14 = (TQualifier *)(**(code **)(*plVar13 + 0x58))();
    DVar5 = TranslateAuxiliaryStorageDecoration(this,pTVar14);
    spv::Builder::addDecoration(&this->builder,IVar1,DVar5,-1);
    IVar1 = local_34;
    plVar13 = (long *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    pTVar14 = (TQualifier *)(**(code **)(*plVar13 + 0x58))();
    addMeshNVDecoration(this,IVar1,-1,pTVar14);
    pTVar14 = (TQualifier *)
              (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
    bVar3 = glslang::TQualifier::hasComponent(pTVar14);
    IVar1 = local_34;
    if (bVar3) {
      lVar8 = (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
      spv::Builder::addDecoration
                (&this->builder,IVar1,Component,(uint)(*(ulong *)(lVar8 + 0x1c) >> 0xc) & 7);
    }
    pTVar14 = (TQualifier *)
              (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
    bVar3 = glslang::TQualifier::hasIndex(pTVar14);
    IVar1 = local_34;
    if (bVar3) {
      lVar8 = (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
      spv::Builder::addDecoration
                (&this->builder,IVar1,DecorationIndex,
                 (ushort)((ulong)*(undefined8 *)(lVar8 + 0x1c) >> 0x30) & 0xff);
    }
    plVar13 = (long *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    pTVar14 = (TQualifier *)(**(code **)(*plVar13 + 0x58))();
    bVar3 = glslang::TQualifier::hasSpecConstantId(pTVar14);
    IVar1 = local_34;
    if (bVar3) {
      plVar13 = (long *)(**(code **)(*(long *)iter.
                                              super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                              ._M_cur + 0xf0))();
      lVar8 = (**(code **)(*plVar13 + 0x58))();
      spv::Builder::addDecoration
                (&this->builder,IVar1,DecorationSpecId,
                 (uint)((ulong)*(undefined8 *)(lVar8 + 0x24) >> 0x28) & 0x7ff);
    }
    pTVar14 = (TQualifier *)
              (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
    bVar3 = glslang::TQualifier::hasOffset(pTVar14);
    IVar1 = local_34;
    if (bVar3) {
      lVar8 = (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
      spv::Builder::addDecoration(&this->builder,IVar1,DecorationOffset,*(int *)(lVar8 + 0x14));
    }
  }
  pTVar14 = (TQualifier *)
            (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
  bVar3 = glslang::TQualifier::hasLocation(pTVar14);
  if ((bVar3) &&
     (((bVar3 = glslang::TIntermediate::isRayTracingStage(this->glslangIntermediate), !bVar3 ||
       ((bVar3 = glslang::TIntermediate::IsRequestedExtension
                           (this->glslangIntermediate,"GL_EXT_ray_tracing"), !bVar3 &&
        (bVar3 = glslang::TIntermediate::IsRequestedExtension
                           (this->glslangIntermediate,"GL_NV_shader_invocation_reorder"), !bVar3))))
      || ((SVar6 = spv::Builder::getStorageClass(&this->builder,local_34), SVar6 != RayPayloadKHR &&
          ((((SVar6 = spv::Builder::getStorageClass(&this->builder,local_34),
             SVar6 != IncomingRayPayloadKHR &&
             (SVar6 = spv::Builder::getStorageClass(&this->builder,local_34),
             SVar6 != CallableDataKHR)) &&
            (SVar6 = spv::Builder::getStorageClass(&this->builder,local_34),
            SVar6 != IncomingCallableDataKHR)) &&
           (SVar6 = spv::Builder::getStorageClass(&this->builder,local_34),
           SVar6 != HitObjectAttributeNV)))))))) {
    IVar1 = local_34;
    lVar8 = (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
    spv::Builder::addDecoration
              (&this->builder,IVar1,DecorationLocation,(uint)*(undefined8 *)(lVar8 + 0x1c) & 0xfff);
  }
  IVar1 = local_34;
  plVar13 = (long *)(**(code **)(*(long *)iter.
                                          super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                          ._M_cur + 0xf0))();
  pTVar14 = (TQualifier *)(**(code **)(*plVar13 + 0x58))();
  DVar5 = TranslateInvariantDecoration(pTVar14);
  spv::Builder::addDecoration(&this->builder,IVar1,DVar5,-1);
  pTVar14 = (TQualifier *)
            (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
  bVar3 = glslang::TQualifier::hasStream(pTVar14);
  if ((bVar3) && (bVar3 = glslang::TIntermediate::isMultiStream(this->glslangIntermediate), bVar3))
  {
    spv::Builder::addCapability(&this->builder,CapabilityGeometryStreams);
    IVar1 = local_34;
    lVar8 = (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
    spv::Builder::addDecoration
              (&this->builder,IVar1,DecorationStream,
               (uint)(byte)((ulong)*(undefined8 *)(lVar8 + 0x1c) >> 0x38));
  }
  pTVar14 = (TQualifier *)
            (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
  bVar3 = glslang::TQualifier::hasSet(pTVar14);
  IVar1 = local_34;
  if (bVar3) {
    lVar8 = (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
    spv::Builder::addDecoration
              (&this->builder,IVar1,DecorationDescriptorSet,
               (uint)(*(ulong *)(lVar8 + 0x1c) >> 0xf) & 0x7f);
  }
  else {
    pTVar9 = (TType *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    bVar3 = IsDescriptorResource(pTVar9);
    if (bVar3) {
      spv::Builder::addDecoration(&this->builder,local_34,DecorationDescriptorSet,0);
    }
  }
  pTVar14 = (TQualifier *)
            (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
  bVar3 = glslang::TQualifier::hasBinding(pTVar14);
  IVar1 = local_34;
  if (bVar3) {
    lVar8 = (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
    spv::Builder::addDecoration
              (&this->builder,IVar1,Binding,
               (uint)((ulong)*(undefined8 *)(lVar8 + 0x1c) >> 0x20) & 0xffff);
  }
  else {
    pTVar9 = (TType *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    bVar3 = IsDescriptorResource(pTVar9);
    if (bVar3) {
      spv::Builder::addDecoration(&this->builder,local_34,Binding,0);
    }
  }
  pTVar14 = (TQualifier *)
            (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
  bVar3 = glslang::TQualifier::hasAttachment(pTVar14);
  IVar1 = local_34;
  if (bVar3) {
    lVar8 = (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
    spv::Builder::addDecoration
              (&this->builder,IVar1,DecorationInputAttachmentIndex,
               (uint)((ulong)*(undefined8 *)(lVar8 + 0x24) >> 0x20) & 0xff);
  }
  bVar3 = glslang::TIntermediate::getXfbMode(this->glslangIntermediate);
  if (bVar3) {
    spv::Builder::addCapability(&this->builder,CapabilityTransformFeedback);
    pTVar14 = (TQualifier *)
              (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
    bVar3 = glslang::TQualifier::hasXfbBuffer(pTVar14);
    IVar1 = local_34;
    if (bVar3) {
      lVar8 = (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
      spv::Builder::addDecoration
                (&this->builder,IVar1,DecorationXfbBuffer,(uint)*(undefined8 *)(lVar8 + 0x24) & 0xf)
      ;
      this_00 = this->glslangIntermediate;
      lVar8 = (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
      memory.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           glslang::TIntermediate::getXfbStride(this_00,(uint)*(undefined8 *)(lVar8 + 0x24) & 0xf);
      if (memory.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != 0x3fff) {
        spv::Builder::addDecoration
                  (&this->builder,local_34,DecorationXfbStride,
                   memory.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      }
    }
    pTVar14 = (TQualifier *)
              (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
    bVar3 = glslang::TQualifier::hasXfbOffset(pTVar14);
    IVar1 = local_34;
    if (bVar3) {
      lVar8 = (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
      spv::Builder::addDecoration
                (&this->builder,IVar1,DecorationOffset,
                 (uint)(*(ulong *)(lVar8 + 0x24) >> 0x12) & 0x1fff);
    }
  }
  if ((forcedType.first != 0x7fffffff) &&
     ((pSVar15 = glslang::TIntermediate::getSpv(this->glslangIntermediate), pSVar15->spv < 0x10600
      || (forcedType.first != 0x19)))) {
    spv::Builder::addDecoration(&this->builder,local_34,BuiltIn,forcedType.first);
  }
  if (((forcedType.first == 0x17) &&
      (bVar3 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate), !bVar3))
     && (pSVar15 = glslang::TIntermediate::getSpv(this->glslangIntermediate), 0x105ff < pSVar15->spv
        )) {
    spv::Builder::addDecoration(&this->builder,local_34,DecorationVolatile,-1);
  }
  plVar13 = (long *)(**(code **)(*(long *)iter.
                                          super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                          ._M_cur + 0xf0))();
  uVar16 = (**(code **)(*plVar13 + 0x158))();
  if ((uVar16 & 1) == 0) {
    pTVar14 = (TQualifier *)
              (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
    bVar3 = glslang::TQualifier::isPipeInput(pTVar14);
    if (!bVar3) goto LAB_005b7f9b;
  }
  std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::vector
            ((vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&decoration);
  plVar13 = (long *)(**(code **)(*(long *)iter.
                                          super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                          ._M_cur + 0xf0))();
  pTVar14 = (TQualifier *)(**(code **)(*plVar13 + 0x58))();
  bVar3 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
  TranslateMemoryDecoration
            (pTVar14,(vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&decoration,bVar3)
  ;
  for (local_bc = 0; uVar16 = (ulong)local_bc,
      sVar17 = std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::size
                         ((vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&decoration),
      IVar1 = local_34, uVar16 < sVar17; local_bc = local_bc + 1) {
    pvVar18 = std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::operator[]
                        ((vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&decoration,
                         (ulong)local_bc);
    spv::Builder::addDecoration(&this->builder,IVar1,*pvVar18,-1);
  }
  std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::~vector
            ((vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)&decoration);
LAB_005b7f9b:
  if (forcedType.first == 0x14) {
    bVar3 = glslang::TIntermediate::getLayoutOverrideCoverage(this->glslangIntermediate);
    if (bVar3) {
      local_c0 = DecorationOverrideCoverageNV;
    }
    else {
      local_c0 = DecorationMax;
    }
    spv::Builder::addDecoration(&this->builder,local_34,local_c0,-1);
    if (local_c0 != DecorationMax) {
      spv::Builder::addCapability(&this->builder,CapabilitySampleMaskOverrideCoverageNV);
      spv::Builder::addExtension(&this->builder,"SPV_NV_sample_mask_override_coverage");
    }
  }
  else if (forcedType.first == 9) {
    lVar8 = (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
    if ((*(byte *)(lVar8 + 0x30) & 1) != 0) {
      spv::Builder::addDecoration(&this->builder,local_34,DecorationViewportRelativeNV,-1);
      spv::Builder::addCapability(&this->builder,CapabilityShaderViewportMaskNV);
      spv::Builder::addExtension(&this->builder,"SPV_NV_viewport_array2");
    }
    lVar8 = (**(code **)(*(long *)iter.
                                  super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                  ._M_cur + 0x110))();
    IVar1 = local_34;
    if (*(int *)(lVar8 + 0x34) != -0x800) {
      lVar8 = (**(code **)(*(long *)iter.
                                    super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                    ._M_cur + 0x110))();
      spv::Builder::addDecoration
                (&this->builder,IVar1,DecorationSecondaryViewportRelativeNV,*(int *)(lVar8 + 0x34));
      spv::Builder::addCapability(&this->builder,CapabilityShaderStereoViewNV);
      spv::Builder::addExtension(&this->builder,"SPV_NV_stereo_view_rendering");
    }
  }
  lVar8 = (**(code **)(*(long *)iter.
                                super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                ._M_cur + 0x110))();
  if ((*(byte *)(lVar8 + 0x2f) & 1) != 0) {
    spv::Builder::addDecoration(&this->builder,local_34,DecorationPassthroughNV,-1);
    spv::Builder::addCapability(&this->builder,CapabilityGeometryShaderPassthroughNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_geometry_shader_passthrough");
  }
  lVar8 = (**(code **)(*(long *)iter.
                                super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                ._M_cur + 0x110))();
  if ((*(ulong *)(lVar8 + 8) >> 0x27 & 1) != 0) {
    spv::Builder::addDecoration(&this->builder,local_34,DecorationPerVertexKHR,-1);
    spv::Builder::addCapability(&this->builder,CapabilityFragmentBarycentricKHR);
    spv::Builder::addExtension(&this->builder,"SPV_NV_fragment_shader_barycentric");
  }
  lVar8 = (**(code **)(*(long *)iter.
                                super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                ._M_cur + 0x110))();
  if ((*(ulong *)(lVar8 + 8) >> 0x28 & 1) != 0) {
    spv::Builder::addDecoration(&this->builder,local_34,DecorationPerVertexKHR,-1);
    spv::Builder::addCapability(&this->builder,CapabilityFragmentBarycentricKHR);
    spv::Builder::addExtension(&this->builder,"SPV_KHR_fragment_shader_barycentric");
  }
  bVar3 = glslang::TIntermediate::getHlslFunctionality1(this->glslangIntermediate);
  if (bVar3) {
    plVar13 = (long *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    plVar13 = (long *)(**(code **)(*plVar13 + 0x58))();
    if (*plVar13 != 0) {
      spv::Builder::addExtension(&this->builder,"SPV_GOOGLE_hlsl_functionality1");
      IVar1 = local_34;
      plVar13 = (long *)(**(code **)(*(long *)iter.
                                              super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                              ._M_cur + 0xf0))();
      puVar19 = (undefined8 *)(**(code **)(*plVar13 + 0x58))();
      spv::Builder::addDecoration
                (&this->builder,IVar1,DecorationHlslSemanticGOOGLE,(char *)*puVar19);
    }
  }
  bVar3 = glslang::TIntermTyped::isReference
                    ((TIntermTyped *)
                     iter.super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                     ._M_cur);
  IVar1 = local_34;
  if (bVar3) {
    plVar13 = (long *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    lVar8 = (**(code **)(*plVar13 + 0x58))();
    DVar5 = AliasedPointer;
    if ((*(ulong *)(lVar8 + 8) >> 0x2e & 1) != 0) {
      DVar5 = DecorationRestrictPointer;
    }
    spv::Builder::addDecoration(&this->builder,IVar1,DVar5,-1);
  }
  plVar13 = (long *)(**(code **)(*(long *)iter.
                                          super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                          ._M_cur + 0xf0))();
  pTVar14 = (TQualifier *)(**(code **)(*plVar13 + 0x58))();
  bVar3 = glslang::TQualifier::hasSpirvDecorate(pTVar14);
  if (bVar3) {
    pTVar9 = (TType *)(**(code **)(*(long *)iter.
                                            super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>
                                            ._M_cur + 0xf0))();
    IVar1 = local_34;
    std::optional<int>::optional(&local_c8);
    applySpirvDecorate(this,pTVar9,IVar1,local_c8);
  }
  return local_34;
}

Assistant:

spv::Id TGlslangToSpvTraverser::getSymbolId(const glslang::TIntermSymbol* symbol)
{
    auto iter = symbolValues.find(symbol->getId());
    spv::Id id;
    if (symbolValues.end() != iter) {
        id = iter->second;
        return id;
    }

    // it was not found, create it
    spv::BuiltIn builtIn = TranslateBuiltInDecoration(symbol->getQualifier().builtIn, false);
    auto forcedType = getForcedType(symbol->getQualifier().builtIn, symbol->getType());

    // There are pairs of symbols that map to the same SPIR-V built-in:
    // gl_ObjectToWorldEXT and gl_ObjectToWorld3x4EXT, and gl_WorldToObjectEXT
    // and gl_WorldToObject3x4EXT. SPIR-V forbids having two OpVariables
    // with the same BuiltIn in the same storage class, so we must re-use one.
    const bool mayNeedToReuseBuiltIn =
        builtIn == spv::BuiltInObjectToWorldKHR ||
        builtIn == spv::BuiltInWorldToObjectKHR;

    if (mayNeedToReuseBuiltIn) {
        auto iter = builtInVariableIds.find(uint32_t(builtIn));
        if (builtInVariableIds.end() != iter) {
            id = iter->second;
            symbolValues[symbol->getId()] = id;
            if (forcedType.second != spv::NoType)
                forceType[id] = forcedType.second;
            return id;
        }
    }

    if (symbol->getBasicType() == glslang::EbtFunction) {
        return 0;
    }

    id = createSpvVariable(symbol, forcedType.first);

    if (mayNeedToReuseBuiltIn) {
        builtInVariableIds.insert({uint32_t(builtIn), id});
    }

    symbolValues[symbol->getId()] = id;
    if (forcedType.second != spv::NoType)
        forceType[id] = forcedType.second;

    if (symbol->getBasicType() != glslang::EbtBlock) {
        builder.addDecoration(id, TranslatePrecisionDecoration(symbol->getType()));
        builder.addDecoration(id, TranslateInterpolationDecoration(symbol->getType().getQualifier()));
        builder.addDecoration(id, TranslateAuxiliaryStorageDecoration(symbol->getType().getQualifier()));
        addMeshNVDecoration(id, /*member*/ -1, symbol->getType().getQualifier());
        if (symbol->getQualifier().hasComponent())
            builder.addDecoration(id, spv::DecorationComponent, symbol->getQualifier().layoutComponent);
        if (symbol->getQualifier().hasIndex())
            builder.addDecoration(id, spv::DecorationIndex, symbol->getQualifier().layoutIndex);
        if (symbol->getType().getQualifier().hasSpecConstantId())
            builder.addDecoration(id, spv::DecorationSpecId, symbol->getType().getQualifier().layoutSpecConstantId);
        // atomic counters use this:
        if (symbol->getQualifier().hasOffset())
            builder.addDecoration(id, spv::DecorationOffset, symbol->getQualifier().layoutOffset);
    }

    if (symbol->getQualifier().hasLocation()) {
        if (!(glslangIntermediate->isRayTracingStage() &&
              (glslangIntermediate->IsRequestedExtension(glslang::E_GL_EXT_ray_tracing) ||
               glslangIntermediate->IsRequestedExtension(glslang::E_GL_NV_shader_invocation_reorder))
              && (builder.getStorageClass(id) == spv::StorageClassRayPayloadKHR ||
                  builder.getStorageClass(id) == spv::StorageClassIncomingRayPayloadKHR ||
                  builder.getStorageClass(id) == spv::StorageClassCallableDataKHR ||
                  builder.getStorageClass(id) == spv::StorageClassIncomingCallableDataKHR ||
                  builder.getStorageClass(id) == spv::StorageClassHitObjectAttributeNV))) {
            // Location values are used to link TraceRayKHR/ExecuteCallableKHR/HitObjectGetAttributesNV
            // to corresponding variables but are not valid in SPIRV since they are supported only
            // for Input/Output Storage classes.
            builder.addDecoration(id, spv::DecorationLocation, symbol->getQualifier().layoutLocation);
        }
    }

    builder.addDecoration(id, TranslateInvariantDecoration(symbol->getType().getQualifier()));
    if (symbol->getQualifier().hasStream() && glslangIntermediate->isMultiStream()) {
        builder.addCapability(spv::CapabilityGeometryStreams);
        builder.addDecoration(id, spv::DecorationStream, symbol->getQualifier().layoutStream);
    }
    if (symbol->getQualifier().hasSet())
        builder.addDecoration(id, spv::DecorationDescriptorSet, symbol->getQualifier().layoutSet);
    else if (IsDescriptorResource(symbol->getType())) {
        // default to 0
        builder.addDecoration(id, spv::DecorationDescriptorSet, 0);
    }
    if (symbol->getQualifier().hasBinding())
        builder.addDecoration(id, spv::DecorationBinding, symbol->getQualifier().layoutBinding);
    else if (IsDescriptorResource(symbol->getType())) {
        // default to 0
        builder.addDecoration(id, spv::DecorationBinding, 0);
    }
    if (symbol->getQualifier().hasAttachment())
        builder.addDecoration(id, spv::DecorationInputAttachmentIndex, symbol->getQualifier().layoutAttachment);
    if (glslangIntermediate->getXfbMode()) {
        builder.addCapability(spv::CapabilityTransformFeedback);
        if (symbol->getQualifier().hasXfbBuffer()) {
            builder.addDecoration(id, spv::DecorationXfbBuffer, symbol->getQualifier().layoutXfbBuffer);
            unsigned stride = glslangIntermediate->getXfbStride(symbol->getQualifier().layoutXfbBuffer);
            if (stride != glslang::TQualifier::layoutXfbStrideEnd)
                builder.addDecoration(id, spv::DecorationXfbStride, stride);
        }
        if (symbol->getQualifier().hasXfbOffset())
            builder.addDecoration(id, spv::DecorationOffset, symbol->getQualifier().layoutXfbOffset);
    }

    // add built-in variable decoration
    if (builtIn != spv::BuiltInMax) {
        // WorkgroupSize deprecated in spirv1.6
        if (glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_6 ||
            builtIn != spv::BuiltInWorkgroupSize)
            builder.addDecoration(id, spv::DecorationBuiltIn, (int)builtIn);
    }

    // Add volatile decoration to HelperInvocation for spirv1.6 and beyond
    if (builtIn == spv::BuiltInHelperInvocation &&
        !glslangIntermediate->usingVulkanMemoryModel() &&
        glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_6) {
        builder.addDecoration(id, spv::DecorationVolatile);
    }

    // Subgroup builtins which have input storage class are volatile for ray tracing stages.
    if (symbol->getType().isImage() || symbol->getQualifier().isPipeInput()) {
        std::vector<spv::Decoration> memory;
        TranslateMemoryDecoration(symbol->getType().getQualifier(), memory,
            glslangIntermediate->usingVulkanMemoryModel());
        for (unsigned int i = 0; i < memory.size(); ++i)
            builder.addDecoration(id, memory[i]);
    }

    if (builtIn == spv::BuiltInSampleMask) {
          spv::Decoration decoration;
          // GL_NV_sample_mask_override_coverage extension
          if (glslangIntermediate->getLayoutOverrideCoverage())
              decoration = (spv::Decoration)spv::DecorationOverrideCoverageNV;
          else
              decoration = (spv::Decoration)spv::DecorationMax;
        builder.addDecoration(id, decoration);
        if (decoration != spv::DecorationMax) {
            builder.addCapability(spv::CapabilitySampleMaskOverrideCoverageNV);
            builder.addExtension(spv::E_SPV_NV_sample_mask_override_coverage);
        }
    }
    else if (builtIn == spv::BuiltInLayer) {
        // SPV_NV_viewport_array2 extension
        if (symbol->getQualifier().layoutViewportRelative) {
            builder.addDecoration(id, (spv::Decoration)spv::DecorationViewportRelativeNV);
            builder.addCapability(spv::CapabilityShaderViewportMaskNV);
            builder.addExtension(spv::E_SPV_NV_viewport_array2);
        }
        if (symbol->getQualifier().layoutSecondaryViewportRelativeOffset != -2048) {
            builder.addDecoration(id, (spv::Decoration)spv::DecorationSecondaryViewportRelativeNV,
                                  symbol->getQualifier().layoutSecondaryViewportRelativeOffset);
            builder.addCapability(spv::CapabilityShaderStereoViewNV);
            builder.addExtension(spv::E_SPV_NV_stereo_view_rendering);
        }
    }

    if (symbol->getQualifier().layoutPassthrough) {
        builder.addDecoration(id, spv::DecorationPassthroughNV);
        builder.addCapability(spv::CapabilityGeometryShaderPassthroughNV);
        builder.addExtension(spv::E_SPV_NV_geometry_shader_passthrough);
    }
    if (symbol->getQualifier().pervertexNV) {
        builder.addDecoration(id, spv::DecorationPerVertexNV);
        builder.addCapability(spv::CapabilityFragmentBarycentricNV);
        builder.addExtension(spv::E_SPV_NV_fragment_shader_barycentric);
    }

    if (symbol->getQualifier().pervertexEXT) {
        builder.addDecoration(id, spv::DecorationPerVertexKHR);
        builder.addCapability(spv::CapabilityFragmentBarycentricKHR);
        builder.addExtension(spv::E_SPV_KHR_fragment_shader_barycentric);
    }

    if (glslangIntermediate->getHlslFunctionality1() && symbol->getType().getQualifier().semanticName != nullptr) {
        builder.addExtension("SPV_GOOGLE_hlsl_functionality1");
        builder.addDecoration(id, (spv::Decoration)spv::DecorationHlslSemanticGOOGLE,
                              symbol->getType().getQualifier().semanticName);
    }

    if (symbol->isReference()) {
        builder.addDecoration(id, symbol->getType().getQualifier().restrict ?
            spv::DecorationRestrictPointerEXT : spv::DecorationAliasedPointerEXT);
    }

    // Add SPIR-V decorations (GL_EXT_spirv_intrinsics)
    if (symbol->getType().getQualifier().hasSpirvDecorate())
        applySpirvDecorate(symbol->getType(), id, {});

    return id;
}